

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupSimpleWithHints(Aig_Man_t *p,Vec_Int_t *vHints)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int local_2c;
  int Entry;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Int_t *vHints_local;
  Aig_Man_t *p_local;
  
  if ((p->nAsserts != 0) && (p->nConstrs != 0)) {
    __assert_fail("p->nAsserts == 0 || p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x70,"Aig_Man_t *Aig_ManDupSimpleWithHints(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  Aig_ManCleanData(p);
  pAVar3 = Aig_ManConst1(p_00);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_2c);
    pAVar4 = Aig_ObjCreateCi(p_00);
    (pAVar3->field_5).pData = pAVar4;
    iVar1 = Aig_ObjId(pAVar3);
    iVar1 = Vec_IntEntry(vHints,iVar1);
    if ((iVar1 == 0) || (iVar1 == 1)) {
      pAVar4 = Aig_ManConst1(p_00);
      pAVar4 = Aig_NotCond(pAVar4,iVar1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      p1 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p_00,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
      iVar1 = Aig_ObjId(pAVar3);
      iVar1 = Vec_IntEntry(vHints,iVar1);
      if ((iVar1 == 0) || (iVar1 == 1)) {
        pAVar4 = Aig_ManConst1(p_00);
        pAVar4 = Aig_NotCond(pAVar4,iVar1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  Aig_ManCleanup(p_00);
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Llb_ManDeriveAigWithHints(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleWithHints( Aig_Man_t * p, Vec_Int_t * vHints )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i, Entry;
    assert( p->nAsserts == 0 || p->nConstrs == 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Llb_ManDeriveAigWithHints(): The check has failed.\n" );
    return pNew;
}